

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_rdft.cc
# Opt level: O1

void cft1st_128_C(float *a)

{
  ulong uVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  fVar6 = *a + a[2];
  fVar7 = a[1] + a[3];
  fVar4 = *a - a[2];
  fVar3 = a[1] - a[3];
  fVar8 = a[4] + a[6];
  fVar11 = a[5] + a[7];
  fVar5 = a[4] - a[6];
  fVar9 = a[5] - a[7];
  *a = fVar6 + fVar8;
  a[1] = fVar7 + fVar11;
  a[4] = fVar6 - fVar8;
  a[5] = fVar7 - fVar11;
  a[2] = fVar4 - fVar9;
  a[3] = fVar3 + fVar5;
  a[6] = fVar9 + fVar4;
  a[7] = fVar3 - fVar5;
  fVar7 = a[8] + a[10];
  fVar8 = a[9] + a[0xb];
  fVar3 = a[8] - a[10];
  fVar5 = a[9] - a[0xb];
  fVar9 = a[0xc] + a[0xe];
  fVar11 = a[0xd] + a[0xf];
  fVar4 = a[0xc] - a[0xe];
  fVar6 = a[0xd] - a[0xf];
  a[8] = fVar7 + fVar9;
  a[9] = fVar8 + fVar11;
  a[0xc] = fVar11 - fVar8;
  a[0xd] = fVar7 - fVar9;
  fVar7 = fVar3 - fVar6;
  fVar8 = fVar5 + fVar4;
  a[10] = (fVar7 - fVar8) * 0.70710677;
  a[0xb] = (fVar8 + fVar7) * 0.70710677;
  fVar6 = fVar6 + fVar3;
  fVar4 = fVar4 - fVar5;
  a[0xe] = (fVar4 - fVar6) * 0.70710677;
  a[0xf] = (fVar4 + fVar6) * 0.70710677;
  uVar1 = 0;
  lVar2 = 0;
  do {
    fVar3 = *(float *)((long)rdft_w + lVar2 + 8);
    fVar4 = *(float *)((long)rdft_w + lVar2 + 0xc);
    fVar5 = *(float *)((long)rdft_w + lVar2 * 2 + 0x10);
    fVar6 = *(float *)((long)rdft_w + lVar2 * 2 + 0x14);
    fVar7 = *(float *)((long)rdft_wk3ri_first + lVar2 + 8);
    fVar8 = *(float *)((long)rdft_wk3ri_first + lVar2 + 0xc);
    fVar13 = a[lVar2 * 2 + 0x10] + a[lVar2 * 2 + 0x12];
    fVar14 = a[lVar2 * 2 + 0x11] + a[lVar2 * 2 + 0x13];
    fVar10 = a[lVar2 * 2 + 0x10] - a[lVar2 * 2 + 0x12];
    fVar9 = a[lVar2 * 2 + 0x11] - a[lVar2 * 2 + 0x13];
    fVar16 = a[lVar2 * 2 + 0x14] + a[lVar2 * 2 + 0x16];
    fVar12 = a[lVar2 * 2 + 0x14] - a[lVar2 * 2 + 0x16];
    fVar15 = a[lVar2 * 2 + 0x15] + a[lVar2 * 2 + 0x17];
    fVar11 = a[lVar2 * 2 + 0x15] - a[lVar2 * 2 + 0x17];
    a[lVar2 * 2 + 0x10] = fVar13 + fVar16;
    a[lVar2 * 2 + 0x11] = fVar14 + fVar15;
    fVar13 = fVar13 - fVar16;
    fVar14 = fVar14 - fVar15;
    a[lVar2 * 2 + 0x14] = fVar3 * fVar13 - fVar14 * fVar4;
    a[lVar2 * 2 + 0x15] = fVar13 * fVar4 + fVar3 * fVar14;
    fVar13 = fVar10 - fVar11;
    fVar14 = fVar9 + fVar12;
    a[lVar2 * 2 + 0x12] = fVar5 * fVar13 - fVar14 * fVar6;
    a[lVar2 * 2 + 0x13] = fVar14 * fVar5 + fVar13 * fVar6;
    fVar11 = fVar11 + fVar10;
    fVar9 = fVar9 - fVar12;
    a[lVar2 * 2 + 0x16] = fVar7 * fVar11 - fVar9 * fVar8;
    a[lVar2 * 2 + 0x17] = fVar9 * fVar7 + fVar11 * fVar8;
    fVar5 = *(float *)((long)rdft_w + lVar2 * 2 + 0x18);
    fVar6 = *(float *)((long)rdft_w + lVar2 * 2 + 0x1c);
    fVar7 = *(float *)((long)rdft_wk3ri_second + lVar2 + 8);
    fVar8 = *(float *)((long)rdft_wk3ri_second + lVar2 + 0xc);
    fVar13 = a[lVar2 * 2 + 0x18] + a[lVar2 * 2 + 0x1a];
    fVar14 = a[lVar2 * 2 + 0x19] + a[lVar2 * 2 + 0x1b];
    fVar10 = a[lVar2 * 2 + 0x18] - a[lVar2 * 2 + 0x1a];
    fVar9 = a[lVar2 * 2 + 0x19] - a[lVar2 * 2 + 0x1b];
    fVar16 = a[lVar2 * 2 + 0x1c] + a[lVar2 * 2 + 0x1e];
    fVar12 = a[lVar2 * 2 + 0x1c] - a[lVar2 * 2 + 0x1e];
    fVar15 = a[lVar2 * 2 + 0x1d] + a[lVar2 * 2 + 0x1f];
    fVar11 = a[lVar2 * 2 + 0x1d] - a[lVar2 * 2 + 0x1f];
    a[lVar2 * 2 + 0x18] = fVar13 + fVar16;
    a[lVar2 * 2 + 0x19] = fVar14 + fVar15;
    fVar13 = fVar13 - fVar16;
    fVar14 = fVar14 - fVar15;
    a[lVar2 * 2 + 0x1c] = -fVar4 * fVar13 - fVar14 * fVar3;
    a[lVar2 * 2 + 0x1d] = fVar13 * fVar3 - fVar4 * fVar14;
    fVar3 = fVar10 - fVar11;
    fVar4 = fVar9 + fVar12;
    a[lVar2 * 2 + 0x1a] = fVar5 * fVar3 - fVar4 * fVar6;
    a[lVar2 * 2 + 0x1b] = fVar4 * fVar5 + fVar3 * fVar6;
    fVar11 = fVar11 + fVar10;
    fVar9 = fVar9 - fVar12;
    a[lVar2 * 2 + 0x1e] = fVar7 * fVar11 - fVar9 * fVar8;
    a[lVar2 * 2 + 0x1f] = fVar9 * fVar7 + fVar11 * fVar8;
    lVar2 = lVar2 + 8;
    uVar1 = uVar1 + 0x10;
  } while (uVar1 < 0x70);
  return;
}

Assistant:

static void cft1st_128_C(float* a) {
  const int n = 128;
  int j, k1, k2;
  float wk1r, wk1i, wk2r, wk2i, wk3r, wk3i;
  float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

  // The processing of the first set of elements was simplified in C to avoid
  // some operations (multiplication by zero or one, addition of two elements
  // multiplied by the same weight, ...).
  x0r = a[0] + a[2];
  x0i = a[1] + a[3];
  x1r = a[0] - a[2];
  x1i = a[1] - a[3];
  x2r = a[4] + a[6];
  x2i = a[5] + a[7];
  x3r = a[4] - a[6];
  x3i = a[5] - a[7];
  a[0] = x0r + x2r;
  a[1] = x0i + x2i;
  a[4] = x0r - x2r;
  a[5] = x0i - x2i;
  a[2] = x1r - x3i;
  a[3] = x1i + x3r;
  a[6] = x1r + x3i;
  a[7] = x1i - x3r;
  wk1r = rdft_w[2];
  x0r = a[8] + a[10];
  x0i = a[9] + a[11];
  x1r = a[8] - a[10];
  x1i = a[9] - a[11];
  x2r = a[12] + a[14];
  x2i = a[13] + a[15];
  x3r = a[12] - a[14];
  x3i = a[13] - a[15];
  a[8] = x0r + x2r;
  a[9] = x0i + x2i;
  a[12] = x2i - x0i;
  a[13] = x0r - x2r;
  x0r = x1r - x3i;
  x0i = x1i + x3r;
  a[10] = wk1r * (x0r - x0i);
  a[11] = wk1r * (x0r + x0i);
  x0r = x3i + x1r;
  x0i = x3r - x1i;
  a[14] = wk1r * (x0i - x0r);
  a[15] = wk1r * (x0i + x0r);
  k1 = 0;
  for (j = 16; j < n; j += 16) {
    k1 += 2;
    k2 = 2 * k1;
    wk2r = rdft_w[k1 + 0];
    wk2i = rdft_w[k1 + 1];
    wk1r = rdft_w[k2 + 0];
    wk1i = rdft_w[k2 + 1];
    wk3r = rdft_wk3ri_first[k1 + 0];
    wk3i = rdft_wk3ri_first[k1 + 1];
    x0r = a[j + 0] + a[j + 2];
    x0i = a[j + 1] + a[j + 3];
    x1r = a[j + 0] - a[j + 2];
    x1i = a[j + 1] - a[j + 3];
    x2r = a[j + 4] + a[j + 6];
    x2i = a[j + 5] + a[j + 7];
    x3r = a[j + 4] - a[j + 6];
    x3i = a[j + 5] - a[j + 7];
    a[j + 0] = x0r + x2r;
    a[j + 1] = x0i + x2i;
    x0r -= x2r;
    x0i -= x2i;
    a[j + 4] = wk2r * x0r - wk2i * x0i;
    a[j + 5] = wk2r * x0i + wk2i * x0r;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j + 2] = wk1r * x0r - wk1i * x0i;
    a[j + 3] = wk1r * x0i + wk1i * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j + 6] = wk3r * x0r - wk3i * x0i;
    a[j + 7] = wk3r * x0i + wk3i * x0r;
    wk1r = rdft_w[k2 + 2];
    wk1i = rdft_w[k2 + 3];
    wk3r = rdft_wk3ri_second[k1 + 0];
    wk3i = rdft_wk3ri_second[k1 + 1];
    x0r = a[j + 8] + a[j + 10];
    x0i = a[j + 9] + a[j + 11];
    x1r = a[j + 8] - a[j + 10];
    x1i = a[j + 9] - a[j + 11];
    x2r = a[j + 12] + a[j + 14];
    x2i = a[j + 13] + a[j + 15];
    x3r = a[j + 12] - a[j + 14];
    x3i = a[j + 13] - a[j + 15];
    a[j + 8] = x0r + x2r;
    a[j + 9] = x0i + x2i;
    x0r -= x2r;
    x0i -= x2i;
    a[j + 12] = -wk2i * x0r - wk2r * x0i;
    a[j + 13] = -wk2i * x0i + wk2r * x0r;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j + 10] = wk1r * x0r - wk1i * x0i;
    a[j + 11] = wk1r * x0i + wk1i * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j + 14] = wk3r * x0r - wk3i * x0i;
    a[j + 15] = wk3r * x0i + wk3i * x0r;
  }
}